

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

sexp_conflict sexp_get_host_name_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  int iVar2;
  char *__name;
  sexp_conflict psVar3;
  uint uVar4;
  ulong __nmemb;
  char buf0 [256];
  sexp_conflict local_140;
  sexp_gc_var_t local_138;
  char local_128 [256];
  
  local_138.var = &local_140;
  local_140 = (sexp_conflict)0x43e;
  local_138.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_138;
  __name = local_128;
  iVar1 = gethostname(__name,0x100);
  if (iVar1 == 0) {
    psVar3 = (sexp_conflict)sexp_c_string(ctx,local_128,0xffffffffffffffff);
  }
  else {
    __nmemb = 0x100;
    do {
      uVar4 = (uint)__nmemb;
      if (0xa00000 < uVar4) {
        psVar3 = (sexp_conflict)
                 sexp_user_exception(ctx,self,"exceeded max auto-expand len in get-host-name",0x23e)
        ;
        goto LAB_00102d6a;
      }
      if (uVar4 != 0x100) {
        free(__name);
      }
      __nmemb = (ulong)(uVar4 * 2);
      __name = (char *)calloc(__nmemb,1);
      iVar2 = gethostname(__name,__nmemb);
    } while (iVar2 != 0);
    psVar3 = (sexp_conflict)sexp_c_string(ctx,__name,0xffffffffffffffff);
    local_140 = psVar3;
    if (iVar1 != 0) {
LAB_00102d6a:
      free(__name);
    }
  }
  (ctx->value).context.saves = local_138.next;
  return psVar3;
}

Assistant:

sexp sexp_get_host_name_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int err = 0;
  char buf0[256];
  int len0;
  char *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  len0 = 256;
  tmp0 = buf0;
 loop:
  err = gethostname(tmp0, len0);
  if (err) {
  if (len0 > 10485760) {
    res = sexp_user_exception(ctx, self, "exceeded max auto-expand len in get-host-name", SEXP_NULL);
} else {
  if (len0 != 256)
    free(tmp0);
  len0 *= 2;
  tmp0 = (char*) calloc(len0, sizeof(tmp0[0]));
  goto loop;
}
  } else {
  res0 = sexp_c_string(ctx, tmp0, -1);
  res = res0;
  }
  if (len0 != 256)
    free(tmp0);
  sexp_gc_release1(ctx);
  return res;
}